

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O1

JsErrorCode JsDiagRemoveBreakpoint(uint breakpointId)

{
  ScriptContext *scriptContext;
  JsrtRuntime *this;
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *pJVar4;
  JsrtDebugManager *this_00;
  undefined4 *puVar5;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_68 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar4 = JsrtContext::GetCurrent();
  JVar3 = CheckContext(pJVar4,false,false);
  if (JVar3 == JsNoError) {
    scriptContext =
         (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_2c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_a8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_68,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_68);
    pJVar4 = JsrtContext::GetCurrent();
    this = (pJVar4->runtime).ptr;
    ThreadContextScope::ThreadContextScope
              ((ThreadContextScope *)&__enterScriptObject.library,this->threadContext);
    JVar3 = JsErrorWrongThread;
    if (__enterScriptObject.library._1_1_ == '\x01') {
      this_00 = JsrtRuntime::GetJsrtDebugManager(this);
      JVar3 = JsErrorDiagNotInDebugMode;
      if (this_00 != (JsrtDebugManager *)0x0) {
        bVar2 = JsrtDebugManager::IsDebugEventCallbackSet(this_00);
        if (bVar2) {
          bVar2 = JsrtDebugManager::RemoveBreakpoint(this_00,breakpointId);
          JVar3 = JsErrorInvalidArgument;
          if (bVar2) {
            JVar3 = JsNoError;
          }
        }
      }
    }
    ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&__enterScriptObject.library);
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_68);
    if ((JVar3 - JsErrorNoCurrentContext < 2) || (JVar3 == JsErrorFatal)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0xcc,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsDiagRemoveBreakpoint(
    _In_ unsigned int breakpointId)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        JsrtContext* currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        ThreadContextScope scope(runtime->GetThreadContext());

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();
        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        if (!jsrtDebugManager->RemoveBreakpoint(breakpointId))
        {
            return JsErrorInvalidArgument;
        }

        return JsNoError;
    });
#endif
}